

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

void __thiscall
cfd::core::Psbt::SetTxInSighashType(Psbt *this,uint32_t index,SigHashType *sighash_type)

{
  void *pvVar1;
  uint32_t uVar2;
  CfdException *this_00;
  undefined4 in_register_00000034;
  int ret;
  int local_44;
  undefined1 local_40 [32];
  
  (*this->_vptr_Psbt[2])(this,CONCAT44(in_register_00000034,index),0x964,"SetTxInSighashType");
  pvVar1 = this->wally_psbt_pointer_;
  uVar2 = SigHashType::GetSigHashFlag(sighash_type);
  local_44 = wally_psbt_input_set_sighash
                       ((ulong)index * 0x110 + *(long *)((long)pvVar1 + 0x10),uVar2);
  if (local_44 == 0) {
    return;
  }
  local_40._0_8_ = "cfdcore_psbt.cpp";
  local_40._8_4_ = 0x96c;
  local_40._16_8_ = "SetTxInSighashType";
  logger::log<int&>((CfdSourceLocation *)local_40,kCfdLogLevelWarning,
                    "wally_psbt_input_set_sighash NG[{}]",&local_44);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_40._0_8_ = local_40 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"psbt set input sighash error.","");
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_40);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Psbt::SetTxInSighashType(
    uint32_t index, const SigHashType &sighash_type) {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  uint32_t sighash = sighash_type.GetSigHashFlag();

  int ret =
      wally_psbt_input_set_sighash(&psbt_pointer->inputs[index], sighash);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_input_set_sighash NG[{}]", ret);
    throw CfdException(
        kCfdIllegalArgumentError, "psbt set input sighash error.");
  }
}